

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

uint8 * __thiscall
sentencepiece::NormalizerSpec::_InternalSerialize
          (NormalizerSpec *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  uint8 *puVar4;
  ulong uVar5;
  int size;
  size_t __n;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  if ((uVar2 & 2) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->precompiled_charsmap_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  if ((uVar2 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->add_dummy_prefix_;
    *target = '\x18';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->remove_extra_whitespaces_;
    *target = ' ';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->escape_whitespaces_;
    *target = '(';
    target[1] = bVar1;
    target = target + 2;
  }
  if ((uVar2 & 4) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,6,(string *)
                                 ((ulong)(this->normalization_rule_tsv_).tagged_ptr_.ptr_ &
                                 0xfffffffffffffffe),target);
  }
  puVar4 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    uVar5 = (ulong)pvVar3 & 0xfffffffffffffffe;
    pvVar3 = *(void **)(uVar5 + 8);
    size = (int)*(undefined8 *)(uVar5 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar4 < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,pvVar3,size,puVar4);
      return puVar4;
    }
    memcpy(puVar4,pvVar3,__n);
    puVar4 = puVar4 + __n;
  }
  return puVar4;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* NormalizerSpec::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.NormalizerSpec)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional bytes precompiled_charsmap = 2;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        2, this->_internal_precompiled_charsmap(), target);
  }

  // optional bool add_dummy_prefix = 3 [default = true];
  if (cached_has_bits & 0x00000008u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(3, this->_internal_add_dummy_prefix(), target);
  }

  // optional bool remove_extra_whitespaces = 4 [default = true];
  if (cached_has_bits & 0x00000010u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(4, this->_internal_remove_extra_whitespaces(), target);
  }

  // optional bool escape_whitespaces = 5 [default = true];
  if (cached_has_bits & 0x00000020u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(5, this->_internal_escape_whitespaces(), target);
  }

  // optional string normalization_rule_tsv = 6;
  if (cached_has_bits & 0x00000004u) {
    target = stream->WriteStringMaybeAliased(
        6, this->_internal_normalization_rule_tsv(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.NormalizerSpec)
  return target;
}